

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStepInnerStepper_EvolveSUNStepper
              (MRIStepInnerStepper stepper,sunrealtype t0,sunrealtype tout,N_Vector y)

{
  int iVar1;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_XMM1_Qa;
  SUNErrCode err;
  sunrealtype tret;
  SUNStepper sunstepper;
  undefined1 local_38 [8];
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  long *local_10;
  int local_4;
  
  local_30 = *in_RDI;
  local_28 = in_RSI;
  local_20 = in_XMM1_Qa;
  local_10 = in_RDI;
  iVar1 = SUNStepper_SetForcing(in_RDI[6],in_RDI[7],local_30,in_RDI[3],(int)in_RDI[4]);
  *(undefined4 *)(local_10 + 5) = *(undefined4 *)(local_30 + 0x18);
  if (iVar1 == 0) {
    iVar1 = SUNStepper_SetStopTime(local_20,local_30);
    *(undefined4 *)(local_10 + 5) = *(undefined4 *)(local_30 + 0x18);
    if (iVar1 == 0) {
      iVar1 = SUNStepper_Evolve(local_20,local_30,local_28,local_38);
      *(undefined4 *)(local_10 + 5) = *(undefined4 *)(local_30 + 0x18);
      if (iVar1 == 0) {
        iVar1 = SUNStepper_SetForcing(0,0x3ff0000000000000,local_30,0,0);
        *(undefined4 *)(local_10 + 5) = *(undefined4 *)(local_30 + 0x18);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          local_4 = -0x33;
        }
      }
      else {
        local_4 = -0x33;
      }
    }
    else {
      local_4 = -0x33;
    }
  }
  else {
    local_4 = -0x33;
  }
  return local_4;
}

Assistant:

int mriStepInnerStepper_EvolveSUNStepper(MRIStepInnerStepper stepper,
                                         SUNDIALS_MAYBE_UNUSED sunrealtype t0,
                                         sunrealtype tout, N_Vector y)
{
  SUNStepper sunstepper = (SUNStepper)stepper->content;
  sunrealtype tret;

  SUNErrCode err     = SUNStepper_SetForcing(sunstepper, stepper->tshift,
                                             stepper->tscale, stepper->forcing,
                                             stepper->nforcing);
  stepper->last_flag = sunstepper->last_flag;
  if (err != SUN_SUCCESS) { return ARK_SUNSTEPPER_ERR; }

  err                = SUNStepper_SetStopTime(sunstepper, tout);
  stepper->last_flag = sunstepper->last_flag;
  if (err != SUN_SUCCESS) { return ARK_SUNSTEPPER_ERR; }

  err                = SUNStepper_Evolve(sunstepper, tout, y, &tret);
  stepper->last_flag = sunstepper->last_flag;
  if (err != SUN_SUCCESS) { return ARK_SUNSTEPPER_ERR; }

  err                = SUNStepper_SetForcing(sunstepper, ZERO, ONE, NULL, 0);
  stepper->last_flag = sunstepper->last_flag;
  if (err != SUN_SUCCESS) { return ARK_SUNSTEPPER_ERR; }

  return ARK_SUCCESS;
}